

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MergeBlocks.cpp
# Opt level: O1

void __thiscall wasm::MergeBlocks::visitExpression(MergeBlocks *this,Expression *curr)

{
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *this_00;
  Expression *ast;
  Expression **ppEVar1;
  bool bVar2;
  pointer pEVar3;
  bool bVar4;
  Expression ***pppEVar5;
  int iVar6;
  uint uVar7;
  Expression *pEVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  ChildIterator *pCVar13;
  Expression **ppEVar14;
  EffectAnalyzer *effects;
  undefined1 other [8];
  optional<wasm::Type> type_;
  undefined1 local_240 [8];
  EffectAnalyzer blockChildEffects;
  undefined1 local_c8 [8];
  ChildIterator iterator;
  undefined1 auStack_78 [8];
  vector<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_> childEffects;
  Expression *local_50;
  Expression *child;
  Expression *back;
  ulong local_38;
  
  if ((0x35 < (ulong)curr->_id) || ((0x3000000000000eU >> ((ulong)curr->_id & 0x3f) & 1) == 0)) {
    auStack_78 = (undefined1  [8])0x0;
    childEffects.super__Vector_base<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    childEffects.super__Vector_base<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    AbstractChildIterator<wasm::ChildIterator>::AbstractChildIterator
              ((AbstractChildIterator<wasm::ChildIterator> *)local_c8,curr);
    iVar6 = (int)((ulong)((long)iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.
                                flexible.
                                super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                                ._M_impl.super__Vector_impl_data._M_start -
                         (long)iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.
                               fixed._M_elems[3]) >> 3) + local_c8._0_4_;
    if (iVar6 == 0) {
      uVar12 = 0xffffffff;
    }
    else {
      lVar10 = (long)iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.flexible.
                     super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
                     _M_impl.super__Vector_impl_data._M_start -
               (long)iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.fixed.
                     _M_elems[3] >> 3;
      uVar9 = (long)local_c8 + lVar10;
      uVar12 = 0xffffffff;
      uVar11 = 0;
      do {
        uVar9 = uVar9 - 1;
        if ((ulong)(lVar10 + (long)local_c8) <= uVar11) goto LAB_00976e9c;
        pCVar13 = (ChildIterator *)
                  (iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.fixed._M_elems
                   [3] + -4);
        if ((uVar9 & 0xfffffffc) == 0) {
          pCVar13 = &iterator;
        }
        uVar7 = (uint)uVar11;
        if ((*(pCVar13->super_AbstractChildIterator<wasm::ChildIterator>).children.fixed._M_elems
              [(uVar9 & 0xffffffff) - 1])->_id != BlockId) {
          uVar7 = uVar12;
        }
        uVar12 = uVar7;
        uVar11 = uVar11 + 1;
      } while (iVar6 != (int)uVar11);
    }
    if (uVar12 != 0xffffffff) {
      if (uVar12 != 0) {
        std::vector<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_>::reserve
                  ((vector<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_> *)auStack_78
                   ,(ulong)uVar12);
      }
      uVar9 = 0;
      back = (Expression *)0x0;
      do {
        uVar11 = ((long)iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.flexible.
                        super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                        ._M_impl.super__Vector_impl_data._M_start -
                  (long)iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.fixed.
                        _M_elems[3] >> 3) + (long)local_c8;
        if (uVar11 <= uVar9) {
LAB_00976e9c:
          __assert_fail("index < children.size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/iteration.h"
                        ,0x4a,
                        "Index wasm::AbstractChildIterator<wasm::ChildIterator>::mapIndex(Index) const [Specific = wasm::ChildIterator]"
                       );
        }
        local_38 = uVar9;
        blockChildEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count = ~uVar9;
        uVar7 = (int)uVar11 +
                (int)blockChildEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                     _M_node_count;
        pppEVar5 = (Expression ***)
                   (iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.fixed.
                    _M_elems[3] + ((ulong)uVar7 - 4));
        if ((uVar7 & 0xfffffffc) == 0) {
          pppEVar5 = iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.fixed.
                     _M_elems + ((ulong)uVar7 - 1);
        }
        pEVar8 = **pppEVar5;
        local_50 = pEVar8;
        if (((pEVar8->_id == BlockId) && (pEVar8[1].type.id == 0)) &&
           (uVar9 = pEVar8[2].type.id, 1 < uVar9)) {
          child = *(Expression **)(*(long *)(pEVar8 + 2) + (uVar9 - 1) * 8);
          if ((pEVar8->type).id == (child->type).id) {
            bVar2 = false;
            uVar11 = 0;
            iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.flexible.
            super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)pEVar8;
            do {
              if (pEVar8[2].type.id <= uVar11) goto LAB_00976ebb;
              ast = *(Expression **)(*(long *)(pEVar8 + 2) + uVar11 * 8);
              if (ast == child) {
                bVar4 = true;
              }
              else {
                EffectAnalyzer::EffectAnalyzer
                          ((EffectAnalyzer *)local_240,
                           &((this->
                             super_WalkerPass<wasm::PostWalker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>_>
                             ).super_Pass.runner)->options,
                           (this->
                           super_WalkerPass<wasm::PostWalker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>_>
                           ).
                           super_PostWalker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>
                           .
                           super_Walker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>
                           .currModule,ast);
                pEVar3 = childEffects.
                         super__Vector_base<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                other = auStack_78;
                if (auStack_78 !=
                    (undefined1  [8])
                    childEffects.
                    super__Vector_base<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_>.
                    _M_impl.super__Vector_impl_data._M_start) {
                  do {
                    bVar4 = EffectAnalyzer::invalidates
                                      ((EffectAnalyzer *)local_240,(EffectAnalyzer *)other);
                    if (bVar4) {
                      bVar2 = true;
                    }
                    other = (undefined1  [8])((long)other + 0x160);
                  } while (other != (undefined1  [8])pEVar3 && !bVar4);
                }
                std::
                _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                             *)&blockChildEffects.breakTargets._M_t._M_impl.super__Rb_tree_header.
                                _M_node_count);
                std::
                _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                             *)&blockChildEffects.danglingPop);
                std::
                _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                             *)&blockChildEffects.mutableGlobalsRead._M_t._M_impl.
                                super__Rb_tree_header._M_node_count);
                std::
                _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                             *)&blockChildEffects.localsWritten._M_t._M_impl.super__Rb_tree_header.
                                _M_node_count);
                std::
                _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                             *)&blockChildEffects.localsRead._M_t._M_impl.super__Rb_tree_header.
                                _M_node_count);
                std::
                _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                             *)&blockChildEffects.features);
                pEVar8 = (Expression *)
                         iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.flexible
                         .
                         super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
                bVar4 = bVar2;
              }
            } while ((!bVar4) && (uVar11 = uVar11 + 1, uVar11 != uVar9));
            if (bVar2) {
              std::vector<wasm::EffectAnalyzer,std::allocator<wasm::EffectAnalyzer>>::
              emplace_back<wasm::PassOptions&,wasm::Module&,wasm::Expression*&>
                        ((vector<wasm::EffectAnalyzer,std::allocator<wasm::EffectAnalyzer>> *)
                         auStack_78,
                         &((this->
                           super_WalkerPass<wasm::PostWalker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>_>
                           ).super_Pass.runner)->options,
                         (this->
                         super_WalkerPass<wasm::PostWalker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>_>
                         ).
                         super_PostWalker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>
                         .
                         super_Walker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>
                         .currModule,&local_50);
            }
            else {
              ppEVar1 = (Expression **)pEVar8[2].type.id;
              if (back == (Expression *)0x0) {
                if (ppEVar1 == (Expression **)0x0) {
                  __assert_fail("usedElements > 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                                ,0xd5,
                                "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::pop_back() [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                               );
                }
                pEVar8[2].type.id = (long)ppEVar1 - 1;
                back = pEVar8;
              }
              else if (ppEVar1 != (Expression **)0x0) {
                this_00 = (ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                          (back + 2);
                ppEVar14 = (Expression **)0x0;
                do {
                  if (iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.flexible.
                      super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage[5] <= ppEVar14) {
LAB_00976ebb:
                    __assert_fail("index < usedElements",
                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                                  ,0xbc,
                                  "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                                 );
                  }
                  if (iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.flexible.
                      super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage[4][(long)ppEVar14] == child)
                  break;
                  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                            (this_00,iterator.super_AbstractChildIterator<wasm::ChildIterator>.
                                     children.flexible.
                                     super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage[4]
                                     [(long)ppEVar14]);
                  ppEVar14 = (Expression **)((long)ppEVar14 + 1);
                } while (ppEVar1 != ppEVar14);
              }
              uVar9 = ((long)iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.
                             flexible.
                             super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                             ._M_impl.super__Vector_impl_data._M_start -
                       (long)iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.
                             fixed._M_elems[3] >> 3) + (long)local_c8;
              if (uVar9 <= local_38) goto LAB_00976e9c;
              uVar7 = (int)uVar9 +
                      (int)blockChildEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                           _M_node_count;
              pppEVar5 = (Expression ***)
                         (iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.fixed.
                          _M_elems[3] + ((ulong)uVar7 - 4));
              if ((uVar7 & 0xfffffffc) == 0) {
                pppEVar5 = iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.fixed.
                           _M_elems + ((ulong)uVar7 - 1);
              }
              **pppEVar5 = child;
              if (local_38 < uVar12) {
                std::vector<wasm::EffectAnalyzer,std::allocator<wasm::EffectAnalyzer>>::
                emplace_back<wasm::PassOptions&,wasm::Module&,wasm::Expression*&>
                          ((vector<wasm::EffectAnalyzer,std::allocator<wasm::EffectAnalyzer>> *)
                           auStack_78,
                           &((this->
                             super_WalkerPass<wasm::PostWalker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>_>
                             ).super_Pass.runner)->options,
                           (this->
                           super_WalkerPass<wasm::PostWalker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>_>
                           ).
                           super_PostWalker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>
                           .
                           super_Walker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>
                           .currModule,&child);
              }
            }
          }
          else {
            std::vector<wasm::EffectAnalyzer,std::allocator<wasm::EffectAnalyzer>>::
            emplace_back<wasm::PassOptions&,wasm::Module&,wasm::Expression*&>
                      ((vector<wasm::EffectAnalyzer,std::allocator<wasm::EffectAnalyzer>> *)
                       auStack_78,
                       &((this->
                         super_WalkerPass<wasm::PostWalker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>_>
                         ).super_Pass.runner)->options,
                       (this->
                       super_WalkerPass<wasm::PostWalker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>_>
                       ).
                       super_PostWalker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>
                       .
                       super_Walker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>
                       .currModule,&local_50);
          }
        }
        else {
          std::vector<wasm::EffectAnalyzer,std::allocator<wasm::EffectAnalyzer>>::
          emplace_back<wasm::PassOptions&,wasm::Module&,wasm::Expression*&>
                    ((vector<wasm::EffectAnalyzer,std::allocator<wasm::EffectAnalyzer>> *)auStack_78
                     ,&((this->
                        super_WalkerPass<wasm::PostWalker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>_>
                        ).super_Pass.runner)->options,
                     (this->
                     super_WalkerPass<wasm::PostWalker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>_>
                     ).
                     super_PostWalker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>
                     .
                     super_Walker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>
                     .currModule,&local_50);
        }
        pEVar8 = back;
        uVar9 = local_38 + 1;
      } while (uVar12 + 1 != (int)uVar9);
      if (back != (Expression *)0x0) {
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                  ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                   (back + 2),curr);
        type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._8_8_ = 1;
        type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_payload =
             (_Storage<wasm::Type,_true>)(curr->type).id;
        Block::finalize((Block *)pEVar8,type_,Unknown);
        Walker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>::
        replaceCurrent(&(this->
                        super_WalkerPass<wasm::PostWalker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>_>
                        ).
                        super_PostWalker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>
                        .
                        super_Walker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>
                       ,pEVar8);
        this->refinalize = true;
      }
    }
    if (iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.fixed._M_elems[3] !=
        (Expression **)0x0) {
      operator_delete(iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.fixed.
                      _M_elems[3],
                      (long)iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.
                            flexible.
                            super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.fixed
                            ._M_elems[3]);
    }
    std::vector<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_>::~vector
              ((vector<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_> *)auStack_78);
  }
  return;
}

Assistant:

void visitExpression(Expression* curr) {
    // Control flow need special handling. Those we can optimize are handled
    // below.
    if (Properties::isControlFlowStructure(curr)) {
      return;
    }

    // As we go through the children, to move things to the outside means
    // moving them past the children before them:
    //
    //  (parent
    //   (child1
    //    (A)
    //    (B)
    //   )
    //   (child2
    //
    // If we move (A) out of parent, then that is fine (further things moved
    // out would appear after it). But if we leave (B) in its current position
    // then if we try to move anything from child2 out of parent then we must
    // move those things past (B). We use a vector to track the effects of the
    // children, where it contains the effects of what was left in the child
    // after optimization.
    std::vector<EffectAnalyzer> childEffects;

    ChildIterator iterator(curr);
    auto numChildren = iterator.getNumChildren();

    // Find the last block among the children, as all we are trying to do here
    // is move the contents of blocks outwards.
    Index lastBlock = -1;
    for (Index i = 0; i < numChildren; i++) {
      if (iterator.getChild(i)->is<Block>()) {
        lastBlock = i;
      }
    }
    if (lastBlock == Index(-1)) {
      // There are no blocks at all, so there is nothing to optimize.
      return;
    }

    // We'll only compute effects up to the child before the last block, since
    // we have nothing to optimize afterwards, which sets a maximum size on the
    // vector.
    if (lastBlock > 0) {
      childEffects.reserve(lastBlock);
    }

    // The outer block that will replace us, containing the contents moved out
    // and then ourselves, assuming we manage to optimize.
    Block* outerBlock = nullptr;

    for (Index i = 0; i <= lastBlock; i++) {
      auto* child = iterator.getChild(i);
      auto* block = child->dynCast<Block>();

      auto continueEarly = [&]() {
        // When we continue early, after failing to find anything to optimize,
        // the effects we need to note for the child are simply those of the
        // child in its original form.
        childEffects.emplace_back(getPassOptions(), *getModule(), child);
      };

      // If there is no block, or it is one that might have branches, or it is
      // too small for us to remove anything from (we cannot remove the last
      // element), or if it has unreachable code (leave that for dce), then give
      // up.
      if (!block || block->name.is() || block->list.size() <= 1) {
        continueEarly();
        continue;
      }

      // Also give up if the block's last element has a different type than the
      // block, as that would mean we would change the type received by the
      // parent (which might cause its type to need to be updated, for example).
      // Leave this alone, as other passes will simplify this anyhow (using
      // refinalize).
      auto* back = block->list.back();
      if (block->type != back->type) {
        continueEarly();
        continue;
      }

      // The block seems to have the shape we want. Check for effects: we want
      // to move all the items out but the last one, so they must all cross over
      // anything we need to move past.
      //
      // In principle we could also handle the case where we can move out only
      // some of the block items. However, that would be more complex (we'd need
      // to allocate a new block sometimes), it is rare, and it may not always
      // be helpful (we wouldn't actually be getting rid of the child block -
      // although, in the binary format such blocks tend to vanish anyhow).
      bool fail = false;
      for (auto* blockChild : block->list) {
        if (blockChild == back) {
          break;
        }
        EffectAnalyzer blockChildEffects(
          getPassOptions(), *getModule(), blockChild);
        for (auto& effects : childEffects) {
          if (blockChildEffects.invalidates(effects)) {
            fail = true;
            break;
          }
        }
        if (fail) {
          break;
        }
      }
      if (fail) {
        continueEarly();
        continue;
      }

      // Wonderful, we can do this! Move our items to an outer block, reusing
      // this one if there isn't one already.
      if (!outerBlock) {
        // Leave all the items there, just remove the last one which will remain
        // where it was.
        block->list.pop_back();
        outerBlock = block;
      } else {
        // Move the items to the existing outer block.
        for (auto* blockChild : block->list) {
          if (blockChild == back) {
            break;
          }
          outerBlock->list.push_back(blockChild);
        }
      }

      // Set the back element as the new child, replacing the block that was
      // there.
      iterator.getChild(i) = back;

      // If there are further elements, we need to know what effects the
      // remaining code has, as if they move they'll move past it.
      if (i < lastBlock) {
        childEffects.emplace_back(getPassOptions(), *getModule(), back);
      }
    }

    if (outerBlock) {
      // We moved items outside, which means we must replace ourselves with the
      // block.
      outerBlock->list.push_back(curr);
      outerBlock->finalize(curr->type);
      replaceCurrent(outerBlock);
      refinalize = true;
    }
  }